

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

hugeint_t duckdb::Hugeint::DivMod(hugeint_t lhs,hugeint_t rhs,hugeint_t *remainder)

{
  uint64_t uVar1;
  long lVar2;
  bool bVar3;
  hugeint_t hVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  duckdb *pdVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  duckdb *pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  hugeint_t hVar18;
  hugeint_t hVar19;
  hugeint_t result;
  hugeint_t local_78;
  hugeint_t local_68;
  hugeint_t local_50;
  ulong local_40;
  ulong local_38;
  
  uVar12 = rhs.upper;
  pdVar13 = (duckdb *)rhs.lower;
  uVar14 = lhs.upper;
  uVar15 = lhs.lower;
  hugeint_t::hugeint_t(&local_78,0);
  if (((duckdb *)local_78.lower == pdVar13) && (local_78.upper == uVar12)) {
    remainder->lower = uVar15;
    remainder->upper = uVar14;
    hugeint_t::hugeint_t(&local_68,0);
    goto LAB_0130fdd7;
  }
  if ((uVar14 == 0x8000000000000000 && uVar15 == 0) ||
     (uVar12 == 0x8000000000000000 && pdVar13 == (duckdb *)0x0)) {
    if (uVar12 == 0x8000000000000000 && pdVar13 == (duckdb *)0x0) {
      bVar17 = uVar14 != 0x8000000000000000;
      bVar3 = uVar15 != 0;
      if (bVar17 || bVar3) {
        remainder->lower = uVar15;
        remainder->upper = uVar14;
      }
      else {
        hugeint_t::hugeint_t(&local_78,0);
        remainder->lower = local_78.lower;
        remainder->upper = local_78.upper;
      }
      hugeint_t::hugeint_t(&local_78,(ulong)(!bVar17 && !bVar3));
    }
    else {
      hugeint_t::hugeint_t(&local_50,1);
      hVar18.upper = local_50.upper | 0x8000000000000000;
      hVar18.lower = local_50.lower;
      local_78 = DivMod(hVar18,rhs,remainder);
      hVar18 = duckdb::Abs(*remainder);
      hugeint_t::hugeint_t(&local_50,1);
      auVar5._8_8_ = local_50.upper;
      auVar5._0_8_ = local_50.lower;
      hVar19 = duckdb::Abs(rhs);
      if (hVar19 == (hugeint_t)((undefined1  [16])hVar18 + auVar5)) {
        hVar19.lower = uVar12;
        iVar10 = Sign(pdVar13,hVar19);
        hugeint_t::hugeint_t(&local_50,(long)iVar10);
        local_78.upper =
             (local_78.upper - local_50.upper) - (ulong)(local_78.lower < local_50.lower);
        local_78.lower = local_78.lower - local_50.lower;
        hugeint_t::hugeint_t(&local_50,0);
        remainder->lower = local_50.lower;
        remainder->upper = local_50.upper;
      }
      else {
        hugeint_t::hugeint_t(&local_50,1);
        uVar12 = remainder->lower;
        remainder->lower = remainder->lower - local_50.lower;
        remainder->upper = (remainder->upper - local_50.upper) - (ulong)(uVar12 < local_50.lower);
      }
    }
    local_68.lower = local_78.lower;
    local_68.upper = local_78.upper;
    goto LAB_0130fdd7;
  }
  uVar16 = ~uVar14 + (ulong)(uVar15 == 0);
  uVar6 = -uVar15;
  if (-1 < (long)uVar14) {
    uVar16 = uVar14;
    uVar6 = uVar15;
  }
  uVar15 = ~uVar12 + (ulong)(pdVar13 == (duckdb *)0x0);
  pdVar7 = (duckdb *)-(long)pdVar13;
  if (-1 < (long)uVar12) {
    uVar15 = uVar12;
    pdVar7 = pdVar13;
  }
  local_68.lower = 0;
  local_68.upper = 0;
  remainder->lower = 0;
  remainder->upper = 0;
  if (uVar16 == 0) {
    if (uVar6 != 0) {
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      bVar9 = (byte)lVar2;
      cVar8 = '@';
      goto LAB_0130fe02;
    }
    bVar9 = 0;
  }
  else {
    lVar2 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    bVar9 = (byte)lVar2;
    cVar8 = -0x80;
LAB_0130fe02:
    bVar9 = cVar8 - (bVar9 ^ 0x3f);
  }
  local_40 = uVar14;
  local_38 = uVar12;
  if (bVar9 != 0) {
    uVar12 = (ulong)bVar9;
    do {
      uVar1 = local_68.lower * 2;
      local_68.upper = local_68.upper << 1 | local_68.lower >> 0x3f;
      uVar14 = remainder->lower;
      remainder->lower = uVar14 * 2;
      remainder->upper = remainder->upper << 1 | uVar14 >> 0x3f;
      iVar10 = (int)uVar12;
      bVar17 = uVar12 < 0x41;
      uVar12 = uVar12 - 1;
      uVar14 = uVar16;
      if (bVar17) {
        uVar14 = uVar6;
      }
      uVar11 = (ulong)(iVar10 - 1U & 0xff);
      if (bVar17) {
        uVar11 = uVar12 & 0xffffffff;
      }
      local_68.lower = uVar1;
      if ((uVar14 >> (uVar11 & 0x3f) & 1) != 0) {
        hugeint_t::hugeint_t(&local_78,1);
        uVar14 = remainder->lower;
        remainder->lower = remainder->lower + local_78.lower;
        remainder->upper = remainder->upper + local_78.upper + (ulong)CARRY8(uVar14,local_78.lower);
      }
      pdVar13 = (duckdb *)remainder->lower;
      uVar14 = remainder->upper;
      if (((long)uVar15 < (long)uVar14) || (pdVar7 <= pdVar13 && uVar14 == uVar15)) {
        remainder->lower = (long)pdVar13 - (long)pdVar7;
        remainder->upper = (uVar14 - uVar15) - (ulong)(pdVar13 < pdVar7);
        hugeint_t::hugeint_t(&local_78,1);
        bVar17 = CARRY8(local_68.lower,local_78.lower);
        local_68.lower = local_68.lower + local_78.lower;
        local_68.upper = local_68.upper + local_78.upper + (ulong)bVar17;
      }
    } while (uVar12 != 0);
  }
  if ((long)(local_38 ^ local_40) < 0) {
    local_68.upper = ~local_68.upper + (ulong)(local_68.lower == 0);
    local_68.lower = -local_68.lower;
  }
  if ((long)local_40 < 0) {
    uVar1 = remainder->lower;
    remainder->lower = -uVar1;
    remainder->upper = ~remainder->upper + (ulong)(uVar1 == 0);
  }
LAB_0130fdd7:
  hVar4.upper = local_68.upper;
  hVar4.lower = local_68.lower;
  return hVar4;
}

Assistant:

hugeint_t Hugeint::DivMod(hugeint_t lhs, hugeint_t rhs, hugeint_t &remainder) {
	if (rhs == 0) {
		remainder = lhs;
		return hugeint_t(0);
	}

	// Check if one of the sides is hugeint_t minimum, as that can't be negated.
	if (lhs == NumericLimits<hugeint_t>::Minimum() || rhs == NumericLimits<hugeint_t>::Minimum()) {
		return DivModMinimum(lhs, rhs, remainder);
	}

	bool lhs_negative = lhs.upper < 0;
	bool rhs_negative = rhs.upper < 0;
	if (lhs_negative) {
		Hugeint::NegateInPlace<false>(lhs);
	}
	if (rhs_negative) {
		Hugeint::NegateInPlace<false>(rhs);
	}
	// DivMod code adapted from:
	// https://github.com/calccrypto/uint128_t/blob/master/uint128_t.cpp

	// initialize the result and remainder to 0
	hugeint_t div_result;
	div_result.lower = 0;
	div_result.upper = 0;
	remainder.lower = 0;
	remainder.upper = 0;

	uint8_t highest_bit_set = PositiveHugeintHighestBit(lhs);
	// now iterate over the amount of bits that are set in the LHS
	for (uint8_t x = highest_bit_set; x > 0; x--) {
		// left-shift the current result and remainder by 1
		div_result = PositiveHugeintLeftShift(div_result, 1);
		remainder = PositiveHugeintLeftShift(remainder, 1);

		// we get the value of the bit at position X, where position 0 is the least-significant bit
		if (PositiveHugeintIsBitSet(lhs, x - 1)) {
			remainder += 1;
		}
		if (Hugeint::GreaterThanEquals(remainder, rhs)) {
			// the remainder has passed the division multiplier: add one to the divide result
			remainder -= rhs;
			div_result += 1;
		}
	}
	if (lhs_negative ^ rhs_negative) {
		Hugeint::NegateInPlace<false>(div_result);
	}
	if (lhs_negative) {
		Hugeint::NegateInPlace<false>(remainder);
	}
	return div_result;
}